

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.c
# Opt level: O2

char * util_shortname(char *path)

{
  char *pcVar1;
  char *pcVar2;
  
  if (path != (char *)0x0) {
    pcVar1 = strrchr(path,0x2f);
    pcVar2 = pcVar1 + 1;
    if (pcVar1 == (char *)0x0) {
      pcVar2 = path;
    }
    return pcVar2;
  }
  fprintf(_stderr,"%s: NULL path passed to short_name\n",argv0);
  abort();
}

Assistant:

const char *
util_shortname(
    const char *path)
{
    const char *ret;
    if (!path) {
        fprintf(stderr, "%s: NULL path passed to short_name\n", argv0);
        abort();
    }
    ret = strrchr(path, '/');
#ifdef _WIN32
    {
        const char *p = strrchr(path, '\\');
        ret = MAX(ret, p);
    }
#endif
    return ret ? ret + 1 : path;
}